

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t zeGetDeviceProcAddrTable(ze_api_version_t version,ze_device_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_device_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= driver::context) {
      pDdiTable->pfnGet = driver::zeDeviceGet;
      pDdiTable->pfnGetSubDevices = driver::zeDeviceGetSubDevices;
      pDdiTable->pfnGetProperties = driver::zeDeviceGetProperties;
      pDdiTable->pfnGetComputeProperties = driver::zeDeviceGetComputeProperties;
      pDdiTable->pfnGetModuleProperties = driver::zeDeviceGetModuleProperties;
      pDdiTable->pfnGetCommandQueueGroupProperties = driver::zeDeviceGetCommandQueueGroupProperties;
      pDdiTable->pfnGetMemoryProperties = driver::zeDeviceGetMemoryProperties;
      pDdiTable->pfnGetMemoryAccessProperties = driver::zeDeviceGetMemoryAccessProperties;
      pDdiTable->pfnGetCacheProperties = driver::zeDeviceGetCacheProperties;
      pDdiTable->pfnGetImageProperties = driver::zeDeviceGetImageProperties;
      pDdiTable->pfnGetExternalMemoryProperties = driver::zeDeviceGetExternalMemoryProperties;
      pDdiTable->pfnGetP2PProperties = driver::zeDeviceGetP2PProperties;
      pDdiTable->pfnCanAccessPeer = driver::zeDeviceCanAccessPeer;
      pDdiTable->pfnGetStatus = driver::zeDeviceGetStatus;
      pDdiTable->pfnGetGlobalTimestamps = driver::zeDeviceGetGlobalTimestamps;
      pDdiTable->pfnImportExternalSemaphoreExt = driver::zeDeviceImportExternalSemaphoreExt;
      pDdiTable->pfnReleaseExternalSemaphoreExt = driver::zeDeviceReleaseExternalSemaphoreExt;
      pDdiTable->pfnGetVectorWidthPropertiesExt = driver::zeDeviceGetVectorWidthPropertiesExt;
      pDdiTable->pfnReserveCacheExt = driver::zeDeviceReserveCacheExt;
      pDdiTable->pfnSetCacheAdviceExt = driver::zeDeviceSetCacheAdviceExt;
      pDdiTable->pfnPciGetPropertiesExt = driver::zeDevicePciGetPropertiesExt;
      pDdiTable->pfnGetRootDevice = driver::zeDeviceGetRootDevice;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetDeviceProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_device_dditable_t* pDdiTable                 ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnGet                                    = driver::zeDeviceGet;

    pDdiTable->pfnGetSubDevices                          = driver::zeDeviceGetSubDevices;

    pDdiTable->pfnGetProperties                          = driver::zeDeviceGetProperties;

    pDdiTable->pfnGetComputeProperties                   = driver::zeDeviceGetComputeProperties;

    pDdiTable->pfnGetModuleProperties                    = driver::zeDeviceGetModuleProperties;

    pDdiTable->pfnGetCommandQueueGroupProperties         = driver::zeDeviceGetCommandQueueGroupProperties;

    pDdiTable->pfnGetMemoryProperties                    = driver::zeDeviceGetMemoryProperties;

    pDdiTable->pfnGetMemoryAccessProperties              = driver::zeDeviceGetMemoryAccessProperties;

    pDdiTable->pfnGetCacheProperties                     = driver::zeDeviceGetCacheProperties;

    pDdiTable->pfnGetImageProperties                     = driver::zeDeviceGetImageProperties;

    pDdiTable->pfnGetExternalMemoryProperties            = driver::zeDeviceGetExternalMemoryProperties;

    pDdiTable->pfnGetP2PProperties                       = driver::zeDeviceGetP2PProperties;

    pDdiTable->pfnCanAccessPeer                          = driver::zeDeviceCanAccessPeer;

    pDdiTable->pfnGetStatus                              = driver::zeDeviceGetStatus;

    pDdiTable->pfnGetGlobalTimestamps                    = driver::zeDeviceGetGlobalTimestamps;

    pDdiTable->pfnImportExternalSemaphoreExt             = driver::zeDeviceImportExternalSemaphoreExt;

    pDdiTable->pfnReleaseExternalSemaphoreExt            = driver::zeDeviceReleaseExternalSemaphoreExt;

    pDdiTable->pfnGetVectorWidthPropertiesExt            = driver::zeDeviceGetVectorWidthPropertiesExt;

    pDdiTable->pfnReserveCacheExt                        = driver::zeDeviceReserveCacheExt;

    pDdiTable->pfnSetCacheAdviceExt                      = driver::zeDeviceSetCacheAdviceExt;

    pDdiTable->pfnPciGetPropertiesExt                    = driver::zeDevicePciGetPropertiesExt;

    pDdiTable->pfnGetRootDevice                          = driver::zeDeviceGetRootDevice;

    return result;
}